

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void __thiscall BSDFSampling_Lambertian_Test::TestBody(BSDFSampling_Lambertian_Test *this)

{
  char *in_stack_000004a8;
  function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
  *in_stack_000004b0;
  _func_BSDF_ptr_SurfaceInteraction_ptr_polymorphic_allocator<std::byte> *in_stack_ffffffffffffffc8;
  function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
  *in_stack_ffffffffffffffd0;
  
  std::
  function<pbrt::BSDF*(pbrt::SurfaceInteraction_const&,pstd::pmr::polymorphic_allocator<std::byte>)>
  ::
  function<pbrt::BSDF*(&)(pbrt::SurfaceInteraction_const&,pstd::pmr::polymorphic_allocator<std::byte>),void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TestBSDF(in_stack_000004b0,in_stack_000004a8);
  std::
  function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
  ::~function((function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
               *)0x4f6ecc);
  return;
}

Assistant:

TEST(BSDFSampling, Lambertian) {
    TestBSDF(createLambertian, "Lambertian");
}